

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

void __thiscall
ON_NurbsCage::ON_NurbsCage
          (ON_NurbsCage *this,ON_3dPoint *box_corners,int order0,int order1,int order2,int cv_count0
          ,int cv_count1,int cv_count2)

{
  ON_Object::ON_Object((ON_Object *)this);
  (this->super_ON_Geometry).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00815928;
  this->m_dim = 0;
  this->m_is_rat = false;
  this->m_order[0] = 0;
  this->m_order[1] = 0;
  *(undefined8 *)(this->m_order + 2) = 0;
  this->m_cv_count[1] = 0;
  this->m_cv_count[2] = 0;
  this->m_knot_capacity[0] = 0;
  this->m_knot_capacity[1] = 0;
  this->m_knot_capacity[2] = 0;
  this->m_knot[0] = (double *)0x0;
  this->m_knot[1] = (double *)0x0;
  this->m_knot[2] = (double *)0x0;
  this->m_cv_stride[0] = 0;
  this->m_cv_stride[1] = 0;
  *(undefined8 *)(this->m_cv_stride + 2) = 0;
  this->m_cv = (double *)0x0;
  Create(this,box_corners,order0,order1,order2,cv_count0,cv_count1,cv_count2);
  return;
}

Assistant:

ON_NurbsCage::ON_NurbsCage( const ON_3dPoint* box_corners, 
                               int order0, int order1, int order2,
                               int cv_count0, int cv_count1, int cv_count2
                               )
: m_dim(0),m_is_rat(0),m_cv_capacity(0),m_cv(0)
{
  m_order[0] = 0;
  m_order[1] = 0;
  m_order[2] = 0;
  m_cv_count[0] = 0;
  m_cv_count[1] = 0;
  m_cv_count[2] = 0;
  m_knot_capacity[0] = 0;
  m_knot_capacity[1] = 0;
  m_knot_capacity[2] = 0;
  m_knot[0] = 0;
  m_knot[1] = 0;
  m_knot[2] = 0;
  m_cv_stride[0] = 0;
  m_cv_stride[1] = 0;
  m_cv_stride[2] = 0;
  Create(box_corners,order0,order1,order2, cv_count0, cv_count1, cv_count2);
}